

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustnessTests.cpp
# Opt level: O0

bool __thiscall
es32cts::RobustBufferAccessBehavior::ReadnPixelsTest::verifyError
          (ReadnPixelsTest *this,GLint error,GLint expectedError,char *method)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  MessageBuilder local_1a8;
  char *local_28;
  char *method_local;
  GLint expectedError_local;
  GLint error_local;
  ReadnPixelsTest *this_local;
  
  if (error != expectedError) {
    local_28 = method;
    method_local._0_4_ = expectedError;
    method_local._4_4_ = error;
    _expectedError_local = this;
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [14])"Test failed! ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_28);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [27])" throws unexpected error [");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)((long)&method_local + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  return error == expectedError;
}

Assistant:

bool ReadnPixelsTest::verifyError(GLint error, GLint expectedError, const char* method)
{
	if (error != expectedError)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! " << method << " throws unexpected error ["
						   << error << "]." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}